

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O3

btbb_piconet * get_piconet(uint32_t lap)

{
  UT_hash_bucket *pUVar1;
  long lVar2;
  UT_hash_handle *pUVar3;
  UT_hash_table *pUVar4;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  uint uVar7;
  btbb_piconet *pbVar8;
  survey_hash *psVar9;
  UT_hash_table *pUVar10;
  UT_hash_bucket *pUVar11;
  uint uVar12;
  UT_hash_handle *pUVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  survey_hash *psVar19;
  uchar *_hj_key;
  uint32_t lap_local;
  
  psVar19 = piconet_survey;
  if (piconet_survey != (survey_hash *)0x0) {
    uVar15 = lap + 0x112410d ^ 0x7f76d;
    uVar7 = uVar15 << 8 ^ 0x9f49bac6 - uVar15;
    uVar12 = uVar7 >> 0xd ^ (-0x112410d - uVar15) - uVar7;
    uVar15 = uVar12 >> 0xc ^ (uVar15 - uVar7) - uVar12;
    uVar16 = uVar15 << 0x10 ^ (uVar7 - uVar12) - uVar15;
    uVar7 = uVar16 >> 5 ^ (uVar12 - uVar15) - uVar16;
    uVar12 = uVar7 >> 3 ^ (uVar15 - uVar16) - uVar7;
    uVar15 = uVar12 << 10 ^ (uVar16 - uVar7) - uVar12;
    pUVar10 = (piconet_survey->hh).tbl;
    for (pUVar13 = pUVar10->buckets
                   [pUVar10->num_buckets - 1 & (uVar15 >> 0xf ^ uVar7 - (uVar12 + uVar15))].hh_head;
        pUVar13 != (UT_hash_handle *)0x0;
        pUVar13 = *(UT_hash_handle **)((long)pUVar13 + (0x30 - lVar2))) {
      lVar2 = pUVar10->hho;
      if ((*(int *)((long)pUVar13 + (0x40 - lVar2)) == 4) &&
         (**(uint32_t **)((long)pUVar13 + (0x38 - lVar2)) == lap)) {
        return *(btbb_piconet **)((long)pUVar13 + (8 - lVar2));
      }
    }
  }
  pbVar8 = (btbb_piconet *)calloc(1,0x1628);
  pbVar8->refcount = 1;
  pbVar8->flags = 8;
  pbVar8->LAP = lap;
  psVar9 = (survey_hash *)malloc(0x48);
  pUVar13 = &psVar9->hh;
  psVar9->key = lap;
  psVar9->pn = pbVar8;
  (psVar9->hh).next = (void *)0x0;
  (psVar9->hh).key = psVar9;
  (psVar9->hh).keylen = 4;
  if (psVar19 == (survey_hash *)0x0) {
    piconet_survey = psVar9;
    (psVar9->hh).prev = (void *)0x0;
    pUVar10 = (UT_hash_table *)calloc(1,0x40);
    (psVar9->hh).tbl = pUVar10;
    if (pUVar10 == (UT_hash_table *)0x0) goto LAB_00106caf;
    pUVar10->tail = pUVar13;
    pUVar10->num_buckets = 0x20;
    pUVar10->log2_num_buckets = 5;
    pUVar10->hho = 0x10;
    pUVar11 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar10->buckets = pUVar11;
    if (pUVar11 == (UT_hash_bucket *)0x0) goto LAB_00106caf;
    pUVar10->signature = 0xa0111fe1;
    psVar19 = psVar9;
  }
  else {
    pUVar10 = (psVar19->hh).tbl;
    pUVar3 = pUVar10->tail;
    pUVar3->next = psVar9;
    (psVar9->hh).prev = (void *)((long)pUVar3 - pUVar10->hho);
    pUVar10->tail = pUVar13;
  }
  uVar18 = pUVar10->num_items + 1;
  pUVar10->num_items = uVar18;
  (psVar9->hh).tbl = pUVar10;
  uVar12 = psVar9->key + 0x112410d ^ 0x7f76d;
  uVar7 = uVar12 << 8 ^ 0x9f49bac6 - uVar12;
  uVar15 = uVar7 >> 0xd ^ (-0x112410d - uVar12) - uVar7;
  uVar16 = uVar15 >> 0xc ^ (uVar12 - uVar7) - uVar15;
  uVar12 = uVar16 << 0x10 ^ (uVar7 - uVar15) - uVar16;
  uVar7 = uVar12 >> 5 ^ (uVar15 - uVar16) - uVar12;
  uVar15 = uVar7 >> 3 ^ (uVar16 - uVar12) - uVar7;
  uVar12 = uVar15 << 10 ^ (uVar12 - uVar7) - uVar15;
  uVar12 = uVar12 >> 0xf ^ uVar7 - (uVar15 + uVar12);
  (psVar9->hh).hashv = uVar12;
  pUVar4 = (psVar19->hh).tbl;
  uVar12 = pUVar4->num_buckets - 1 & uVar12;
  pUVar11 = pUVar4->buckets;
  uVar7 = pUVar11[uVar12].count + 1;
  pUVar11[uVar12].count = uVar7;
  pUVar3 = pUVar11[uVar12].hh_head;
  (psVar9->hh).hh_next = pUVar3;
  (psVar9->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar3 != (UT_hash_handle *)0x0) {
    pUVar3->hh_prev = pUVar13;
  }
  pUVar11[uVar12].hh_head = pUVar13;
  if ((pUVar11[uVar12].expand_mult * 10 + 10 <= uVar7) && (pUVar10->noexpand != 1)) {
    uVar7 = pUVar10->num_buckets;
    pUVar11 = (UT_hash_bucket *)calloc(1,(ulong)(uVar7 * 2) << 4);
    if (pUVar11 == (UT_hash_bucket *)0x0) {
LAB_00106caf:
      exit(-1);
    }
    uVar12 = uVar7 * 2 - 1;
    uVar15 = ((uVar18 >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar12 & uVar18) == 0);
    pUVar10->ideal_chain_maxlen = uVar15;
    pUVar10->nonideal_items = 0;
    __ptr = pUVar10->buckets;
    if ((ulong)uVar7 != 0) {
      uVar16 = 0;
      uVar17 = 0;
      do {
        pUVar3 = __ptr[uVar17].hh_head;
        while (pUVar3 != (UT_hash_handle *)0x0) {
          pUVar5 = pUVar3->hh_next;
          uVar14 = pUVar3->hashv & uVar12;
          pUVar1 = pUVar11 + uVar14;
          uVar18 = pUVar11[uVar14].count + 1;
          pUVar11[uVar14].count = uVar18;
          if (uVar15 < uVar18) {
            uVar16 = uVar16 + 1;
            pUVar10->nonideal_items = uVar16;
            pUVar1->expand_mult = uVar18 / uVar15;
          }
          pUVar3->hh_prev = (UT_hash_handle *)0x0;
          pUVar6 = pUVar1->hh_head;
          pUVar3->hh_next = pUVar6;
          if (pUVar6 != (UT_hash_handle *)0x0) {
            pUVar6->hh_prev = pUVar3;
          }
          pUVar1->hh_head = pUVar3;
          pUVar3 = pUVar5;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar7);
    }
    free(__ptr);
    pUVar10 = pUVar13->tbl;
    pUVar10->num_buckets = pUVar10->num_buckets << 1;
    pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
    pUVar10->buckets = pUVar11;
    if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
      uVar7 = pUVar10->ineff_expands + 1;
      pUVar10->ineff_expands = uVar7;
      if (1 < uVar7) {
        pUVar10->noexpand = 1;
      }
    }
    else {
      pUVar10->ineff_expands = 0;
    }
  }
  return pbVar8;
}

Assistant:

btbb_piconet *get_piconet(uint32_t lap)
{
	survey_hash *s;
	btbb_piconet *pn;
	HASH_FIND(hh, piconet_survey, &lap, 4, s);

	if (s == NULL) {
		pn = btbb_piconet_new();
		btbb_init_piconet(pn, lap);

		s = malloc(sizeof(survey_hash));
		s->key = lap;
		s->pn = pn;
		HASH_ADD(hh, piconet_survey, key, 4, s);
	} else {
		pn = s->pn;
	}
	return pn;
}